

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.cpp
# Opt level: O0

void __thiscall backend::Backend::show_passes(Backend *this,ostream *o)

{
  bool bVar1;
  byte bVar2;
  pointer pMVar3;
  ostream *poVar4;
  pointer pAVar5;
  ostream *in_RSI;
  long in_RDI;
  unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *pass_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
  *__range1_1;
  unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *pass;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
  *__range1;
  ostream *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  Backend *in_stack_fffffffffffffe90;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  reference local_c0;
  unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *local_b8;
  __normal_iterator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>_>
  local_b0;
  long local_a8;
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  reference local_30;
  unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *local_28;
  __normal_iterator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>_>
  local_20;
  long local_18;
  ostream *local_10;
  
  local_18 = in_RDI + 0x68;
  local_10 = in_RSI;
  local_20._M_current =
       (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *)
       std::
       vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
       ::begin((vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
                *)in_stack_fffffffffffffe48);
  local_28 = (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )std::
              vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
              ::end((vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
                     *)in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>_>
               ::operator*(&local_20);
    pMVar3 = std::
             unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
             operator->((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                         *)0x1d21bd);
    (**pMVar3->_vptr_MirOptimizePass)();
    bVar1 = should_run_pass(in_stack_fffffffffffffe90,
                            (string *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88))
    ;
    std::__cxx11::string::~string(local_50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      in_stack_fffffffffffffe90 = (Backend *)std::operator<<(local_10," Run: ");
      pMVar3 = std::
               unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               ::operator->((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                             *)0x1d2308);
      (**pMVar3->_vptr_MirOptimizePass)();
      poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffe90,local_a0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_a0);
    }
    else {
      poVar4 = std::operator<<(local_10,"Skip: ");
      pMVar3 = std::
               unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               ::operator->((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                             *)0x1d2243);
      (**pMVar3->_vptr_MirOptimizePass)();
      poVar4 = std::operator<<(poVar4,local_80);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_80);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>_>
    ::operator++(&local_20);
  }
  poVar4 = std::operator<<(local_10," Run: mir_to_arm");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_a8 = in_RDI + 0x80;
  local_b0._M_current =
       (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *)
       std::
       vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
       ::begin((vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
                *)in_stack_fffffffffffffe48);
  local_b8 = (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )std::
              vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
              ::end((vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
                     *)in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>_>
               ::operator*(&local_b0);
    pAVar5 = std::
             unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>::
             operator->((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
                         *)0x1d2435);
    (**pAVar5->_vptr_ArmOptimizePass)();
    in_stack_fffffffffffffe8f =
         should_run_pass(in_stack_fffffffffffffe90,
                         (string *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    bVar2 = in_stack_fffffffffffffe8f ^ 0xff;
    std::__cxx11::string::~string(local_e0);
    if ((bVar2 & 1) == 0) {
      in_stack_fffffffffffffe48 = std::operator<<(local_10," Run: ");
      pAVar5 = std::
               unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
               ::operator->((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
                             *)0x1d2573);
      in_stack_fffffffffffffe50 = local_120;
      (**pAVar5->_vptr_ArmOptimizePass)();
      poVar4 = std::operator<<(in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_120);
    }
    else {
      poVar4 = std::operator<<(local_10,"Skip: ");
      pAVar5 = std::
               unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
               ::operator->((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
                             *)0x1d24af);
      (**pAVar5->_vptr_ArmOptimizePass)();
      poVar4 = std::operator<<(poVar4,local_100);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_100);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_*,_std::vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>_>
    ::operator++(&local_b0);
  }
  return;
}

Assistant:

void Backend::show_passes(std::ostream& o) {
  for (auto& pass : mir_passes) {
    if (!should_run_pass(pass->pass_name())) {
      o << "Skip: " << pass->pass_name() << std::endl;
    } else {
      o << " Run: " << pass->pass_name() << std::endl;
    }
  }
  o << " Run: mir_to_arm" << std::endl;
  for (auto& pass : arm_passes) {
    if (!should_run_pass(pass->pass_name())) {
      o << "Skip: " << pass->pass_name() << std::endl;
    } else {
      o << " Run: " << pass->pass_name() << std::endl;
    }
  }
}